

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<short,unsigned_long_long>(void)

{
  short ret;
  short ret_2;
  short ret_5;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_44;
  short local_42;
  uint64_t local_40;
  short local_32;
  
  local_44.m_int = 0;
  local_42 = 0;
  local_40 = 0;
  MultiplicationHelper<short,unsigned_long_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,&local_40,&local_42);
  local_42 = 0;
  local_40 = 0;
  MultiplicationHelper<short,unsigned_long_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_44.m_int,&local_40,&local_42);
  local_40 = 0;
  MultiplicationHelper<short,unsigned_long_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_44.m_int,&local_40,&local_44.m_int);
  local_40 = 0;
  MultiplicationHelper<short,unsigned_long_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_44.m_int,&local_40,&local_44.m_int);
  local_44.m_int = 1;
  local_40 = local_40 & 0xffffffffffff0000;
  local_42 = 1;
  DivisionHelper<short,short,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_44.m_int,&local_42,(short *)&local_40);
  operator/(1,local_44);
  if (local_44.m_int == 0) {
    local_44.m_int = 0;
  }
  if (local_44.m_int == 0) {
    local_44.m_int = 0;
  }
  local_40 = 1;
  local_42 = 0;
  AdditionHelper<short,unsigned_long_long,14>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_44.m_int,&local_40,&local_42);
  if (0xfffeffff < (int)local_44.m_int - 0x7fffU) {
    local_40 = 1;
    local_42 = 0;
    local_32 = local_44.m_int;
    AdditionHelper<short,unsigned_long_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_32,&local_40,&local_42);
    local_40 = 1;
    AdditionHelper<short,unsigned_long_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_44.m_int,&local_40,&local_44.m_int);
    local_40 = 1;
    AdditionHelper<short,unsigned_long_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_44.m_int,&local_40,&local_44.m_int);
    local_44.m_int = 0;
    local_42 = 0;
    local_40 = 0;
    local_32 = 0;
    SubtractionHelper<unsigned_long_long,short,15>::
    SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_40,&local_42,&local_32);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}